

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocCleanAndRepair(TidyDocImpl *doc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  TidyConfigChangeCallback p_Var11;
  int iVar12;
  Bool wantName;
  Bool BVar13;
  Node *pNVar14;
  AttVal *pAVar15;
  tmbstr ptVar16;
  Node *node_1;
  AttVal *fpi;
  TidyConfigChangeCallback callback;
  Node *node;
  Bool mergeEmphasis;
  Bool wantNameAttr;
  Bool tidyXmlTags;
  Bool tidyMark;
  Bool xmlDecl;
  Bool xhtmlOut;
  Bool xmlOut;
  Bool htmlOut;
  Bool gdoc;
  Bool clean;
  Bool logical;
  Bool word2K;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x59].v;
  uVar2 = (doc->config).value[0x2d].v;
  uVar3 = (doc->config).value[0x30].v;
  uVar4 = (doc->config).value[0x1f].v;
  iVar12 = (int)(doc->config).value[0x21].v;
  uVar5 = (doc->config).value[100].v;
  uVar6 = (doc->config).value[0x62].v;
  uVar7 = (doc->config).value[99].v;
  uVar8 = (doc->config).value[0x31].v;
  uVar9 = (doc->config).value[0x67].v;
  wantName = (Bool)(doc->config).value[3].v;
  uVar10 = (doc->config).value[0x33].v;
  p_Var11 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if ((int)uVar9 == 0) {
    prvTidyCleanStyle(doc,&doc->root);
    if ((int)uVar10 != 0) {
      prvTidyNestedEmphasis(doc,&doc->root);
    }
    prvTidyList2BQ(doc,&doc->root);
    prvTidyBQ2Div(doc,&doc->root);
    if ((int)uVar2 != 0) {
      prvTidyEmFromI(doc,&doc->root);
    }
    if (((int)uVar1 != 0) && (BVar13 = prvTidyIsWord2000(doc), BVar13 != no)) {
      prvTidyDropSections(doc,&doc->root);
      prvTidyCleanWord2000(doc,&doc->root);
      prvTidyDropEmptyElements(doc,&doc->root);
    }
    if ((int)uVar3 != 0) {
      prvTidyCleanDocument(doc);
    }
    if ((int)uVar4 != 0) {
      prvTidyCleanGoogleDocument(doc);
    }
    prvTidyTidyMetaCharset(doc);
    BVar13 = prvTidyCheckNodeIntegrity(&doc->root);
    if (BVar13 == no) {
      (*doc->allocator->vtbl->panic)(doc->allocator,integrity);
    }
    pNVar14 = prvTidyFindDocType(doc);
    if (((pNVar14 != (Node *)0x0) &&
        (pAVar15 = prvTidyGetAttrByName(pNVar14,"PUBLIC"), pAVar15 != (AttVal *)0x0)) &&
       (pAVar15->value != (tmbstr)0x0)) {
      if (doc->givenDoctype != (tmbstr)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,doc->givenDoctype);
      }
      ptVar16 = prvTidytmbstrdup(doc->allocator,pAVar15->value);
      doc->givenDoctype = ptVar16;
    }
    if ((doc->root).content != (Node *)0x0) {
      if (((iVar12 != 0) && (doc->lexer->isvoyager != no)) &&
         (pNVar14 = prvTidyFindDocType(doc), pNVar14 != (Node *)0x0)) {
        prvTidyRemoveNode(pNVar14);
      }
      if (((int)uVar6 == 0) || (iVar12 != 0)) {
        prvTidyFixDocType(doc);
        prvTidyFixAnchors(doc,&doc->root,wantName,yes);
        prvTidyFixXhtmlNamespace(doc,no);
        prvTidyFixLanguageInformation(doc,&doc->root,no,yes);
      }
      else {
        prvTidySetXHTMLDocType(doc);
        prvTidyFixAnchors(doc,&doc->root,wantName,yes);
        prvTidyFixXhtmlNamespace(doc,yes);
        prvTidyFixLanguageInformation(doc,&doc->root,yes,yes);
      }
      if ((int)uVar8 != 0) {
        prvTidyAddGenerator(doc);
      }
    }
    if (((int)uVar5 != 0) && ((int)uVar7 != 0)) {
      prvTidyFixXmlDecl(doc);
    }
    if (doc->lexer != (Lexer *)0x0) {
      if ((doc->lexer->versionEmitted & 0x60000) != 0) {
        prvTidyCheckHTML5(doc,&doc->root);
      }
      prvTidyCheckHTMLTagsAttribsVersions(doc,&doc->root);
      if ((doc->lexer->isvoyager == no) && (doc->xmlDetected != no)) {
        pNVar14 = prvTidyFindXmlDecl(doc);
        prvTidyReport(doc,(Node *)0x0,pNVar14,0x291);
      }
    }
    prvTidyCleanHead(doc);
    doc->pConfigChangeCallback = p_Var11;
    doc_local._4_4_ = tidyDocStatus(doc);
  }
  else {
    doc->pConfigChangeCallback = p_Var11;
    doc_local._4_4_ = tidyDocStatus(doc);
  }
  return doc_local._4_4_;
}

Assistant:

int         tidyDocCleanAndRepair( TidyDocImpl* doc )
{
    Bool word2K   = cfgBool( doc, TidyWord2000 );
    Bool logical  = cfgBool( doc, TidyLogicalEmphasis );
    Bool clean    = cfgBool( doc, TidyMakeClean );
    Bool gdoc     = cfgBool( doc, TidyGDocClean );
    Bool htmlOut  = cfgBool( doc, TidyHtmlOut );
    Bool xmlOut   = cfgBool( doc, TidyXmlOut );
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Bool xmlDecl  = cfgBool( doc, TidyXmlDecl );
    Bool tidyMark = cfgBool( doc, TidyMark );
    Bool tidyXmlTags = cfgBool( doc, TidyXmlTags );
    Bool wantNameAttr = cfgBool( doc, TidyAnchorAsName );
    Bool mergeEmphasis = cfgBool( doc, TidyMergeEmphasis );
    Node* node;
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    doc->pConfigChangeCallback = NULL;

#if defined(ENABLE_DEBUG_LOG)
    SPRTF("All nodes BEFORE clean and repair\n");
    dbg_show_all_nodes( doc, &doc->root, 0  );
#endif
    if (tidyXmlTags)
    {
        doc->pConfigChangeCallback = callback;
        return tidyDocStatus( doc );
    }

    /* Issue #567 - move style elements from body to head */
    TY_(CleanStyle)(doc, &doc->root);

    /* simplifies <b><b> ... </b> ...</b> etc. */
    if ( mergeEmphasis )
        TY_(NestedEmphasis)( doc, &doc->root );

    /* cleans up <dir>indented text</dir> etc. */
    TY_(List2BQ)( doc, &doc->root );
    TY_(BQ2Div)( doc, &doc->root );

    /* replaces i by em and b by strong */
    if ( logical )
        TY_(EmFromI)( doc, &doc->root );

    if ( word2K && TY_(IsWord2000)(doc) )
    {
        /* prune Word2000's <![if ...]> ... <![endif]> */
        TY_(DropSections)( doc, &doc->root );

        /* drop style & class attributes and empty p, span elements */
        TY_(CleanWord2000)( doc, &doc->root );
        TY_(DropEmptyElements)(doc, &doc->root);
    }

    /* replaces presentational markup by style rules */
    if ( clean )
        TY_(CleanDocument)( doc );

    /* clean up html exported by Google Docs */
    if ( gdoc )
        TY_(CleanGoogleDocument)( doc );

    /*  Reconcile http-equiv meta element with output encoding  */
    TY_(TidyMetaCharset)(doc);

    if ( !TY_(CheckNodeIntegrity)( &doc->root ) )
        TidyPanic( doc->allocator, integrity );

    /* remember given doctype for reporting */
    node = TY_(FindDocType)(doc);

    if (node)
    {
        AttVal* fpi = TY_(GetAttrByName)(node, "PUBLIC");
        if (AttrHasValue(fpi))
        {
            if (doc->givenDoctype)
                TidyDocFree(doc, doc->givenDoctype);
            doc->givenDoctype = TY_(tmbstrdup)(doc->allocator,fpi->value);
        }
    }

    if ( doc->root.content )
    {
        /* If we had XHTML input but want HTML output */
        if ( htmlOut && doc->lexer->isvoyager )
        {
            Node* node = TY_(FindDocType)(doc);
            /* Remove reference, but do not free */
            if (node)
              TY_(RemoveNode)(node);
        }

        if (xhtmlOut && !htmlOut)
        {
            TY_(SetXHTMLDocType)(doc);
            TY_(FixAnchors)(doc, &doc->root, wantNameAttr, yes);
            TY_(FixXhtmlNamespace)(doc, yes);
            TY_(FixLanguageInformation)(doc, &doc->root, yes, yes);
        }
        else
        {
            TY_(FixDocType)(doc);
            TY_(FixAnchors)(doc, &doc->root, wantNameAttr, yes);
            TY_(FixXhtmlNamespace)(doc, no);
            TY_(FixLanguageInformation)(doc, &doc->root, no, yes);
        }

        if (tidyMark )
            TY_(AddGenerator)(doc);

    }

    /* ensure presence of initial <?xml version="1.0"?> */
    if ( xmlOut && xmlDecl )
        TY_(FixXmlDecl)( doc );

    /* At this point the apparent doctype is going to be as stable as
       it can ever be, so we can start detecting things that shouldn't
       be in this version of HTML
     */
    if (doc->lexer) 
    {
        /*\ 
         *  Issue #429 #426 - These services can only be used
         *  when there is a document loaded, ie a lexer created.
         *  But really should not be calling a Clean and Repair
         *  service with no doc!
        \*/
        if (doc->lexer->versionEmitted & VERS_HTML5)
            TY_(CheckHTML5)( doc, &doc->root );
        TY_(CheckHTMLTagsAttribsVersions)( doc, &doc->root );

        if ( !doc->lexer->isvoyager && doc->xmlDetected )
        {
            TY_(Report)(doc, NULL, TY_(FindXmlDecl)(doc), XML_DECLARATION_DETECTED );

        }
    }

    TY_(CleanHead)(doc); /* Is #692 - discard multiple <title> tags */

#if defined(ENABLE_DEBUG_LOG)
    SPRTF("All nodes AFTER clean and repair\n");
    dbg_show_all_nodes( doc, &doc->root, 0  );
#endif

    doc->pConfigChangeCallback = callback;
    return tidyDocStatus( doc );
}